

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Upsert * sqlite3UpsertDup(sqlite3 *db,Upsert *p)

{
  ExprList *pTarget;
  Expr *pTargetWhere;
  ExprList *pSet;
  Expr *pWhere;
  Upsert *pUVar1;
  
  if (p != (Upsert *)0x0) {
    pTarget = sqlite3ExprListDup(db,p->pUpsertTarget,0);
    pTargetWhere = sqlite3ExprDup(db,p->pUpsertTargetWhere,0);
    pSet = sqlite3ExprListDup(db,p->pUpsertSet,0);
    pWhere = sqlite3ExprDup(db,p->pUpsertWhere,0);
    pUVar1 = sqlite3UpsertDup(db,p->pNextUpsert);
    pUVar1 = sqlite3UpsertNew(db,pTarget,pTargetWhere,pSet,pWhere,pUVar1);
    return pUVar1;
  }
  return (Upsert *)0x0;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertDup(sqlite3 *db, Upsert *p){
  if( p==0 ) return 0;
  return sqlite3UpsertNew(db,
           sqlite3ExprListDup(db, p->pUpsertTarget, 0),
           sqlite3ExprDup(db, p->pUpsertTargetWhere, 0),
           sqlite3ExprListDup(db, p->pUpsertSet, 0),
           sqlite3ExprDup(db, p->pUpsertWhere, 0),
           sqlite3UpsertDup(db, p->pNextUpsert)
         );
}